

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlNsDumpOutput(xmlOutputBufferPtr buf,xmlNsPtr cur,xmlSaveCtxtPtr ctxt)

{
  int iVar1;
  
  if (((buf != (xmlOutputBufferPtr)0x0 && cur != (xmlNsPtr)0x0) && (cur->type == XML_NAMESPACE_DECL)
      ) && (cur->href != (xmlChar *)0x0)) {
    iVar1 = xmlStrEqual(cur->prefix,"xml");
    if (iVar1 == 0) {
      if ((ctxt == (xmlSaveCtxtPtr)0x0) || (ctxt->format != 2)) {
        xmlOutputBufferWrite(buf,1," ");
      }
      else {
        xmlOutputBufferWriteWSNonSig(ctxt,2);
      }
      if (cur->prefix == (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,5,"xmlns");
      }
      else {
        xmlOutputBufferWrite(buf,6,"xmlns:");
        xmlOutputBufferWriteString(buf,(char *)cur->prefix);
      }
      xmlOutputBufferWrite(buf,1,"=");
      xmlBufWriteQuotedString(buf->buffer,cur->href);
      return;
    }
  }
  return;
}

Assistant:

static void
xmlNsDumpOutput(xmlOutputBufferPtr buf, xmlNsPtr cur, xmlSaveCtxtPtr ctxt) {
    if ((cur == NULL) || (buf == NULL)) return;
    if ((cur->type == XML_LOCAL_NAMESPACE) && (cur->href != NULL)) {
	if (xmlStrEqual(cur->prefix, BAD_CAST "xml"))
	    return;

	if (ctxt != NULL && ctxt->format == 2)
	    xmlOutputBufferWriteWSNonSig(ctxt, 2);
	else
	    xmlOutputBufferWrite(buf, 1, " ");

        /* Within the context of an element attributes */
	if (cur->prefix != NULL) {
	    xmlOutputBufferWrite(buf, 6, "xmlns:");
	    xmlOutputBufferWriteString(buf, (const char *)cur->prefix);
	} else
	    xmlOutputBufferWrite(buf, 5, "xmlns");
	xmlOutputBufferWrite(buf, 1, "=");
	xmlBufWriteQuotedString(buf->buffer, cur->href);
    }
}